

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O2

void dlib::fill_rect<dlib::rgb_pixel>(canvas *c,rectangle *rect,rgb_pixel *pixel)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  rectangle area;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  rectangle::intersect(rect,&c->super_rectangle);
  for (; local_30 <= local_20; local_30 = local_30 + 1) {
    puVar4 = c->bits;
    uVar1 = pixel->red;
    uVar2 = pixel->green;
    uVar3 = pixel->blue;
    lVar6 = (local_30 - (c->super_rectangle).t) * c->row_width + (c->super_rectangle).l * -4;
    for (lVar5 = local_38; lVar5 <= local_28; lVar5 = lVar5 + 1) {
      puVar4[lVar5 * 4 + lVar6 + 2] = uVar1;
      puVar4[lVar5 * 4 + lVar6 + 1] = uVar2;
      puVar4[lVar5 * 4 + lVar6] = uVar3;
    }
  }
  return;
}

Assistant:

void fill_rect (
        const canvas& c,
        const rectangle& rect,
        const pixel_type& pixel
    )
    {
        rectangle area = rect.intersect(c);
        for (long y = area.top(); y <= area.bottom(); ++y)
        {
            for (long x = area.left(); x <= area.right(); ++x)
            {
                assign_pixel(c[y-c.top()][x-c.left()], pixel);
            }
        }
    }